

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Deferred<kj::Function<void_()>_> * __thiscall
kj::PausableReadAsyncIoStream::trackWrite
          (Deferred<kj::Function<void_()>_> *__return_storage_ptr__,PausableReadAsyncIoStream *this)

{
  bool bVar1;
  Function<void_()> *func;
  Type local_50;
  undefined1 local_48 [40];
  Fault f;
  DebugExpression<bool> _kjCondition;
  PausableReadAsyncIoStream *this_local;
  
  f.exception._6_1_ = (this->currentlyWriting ^ 0xffU) & 1;
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[42]>
              ((Fault *)(local_48 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x16d8,FAILED,"!currentlyWriting",
               "_kjCondition,\"only one write is allowed at any one time\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [42])"only one write is allowed at any one time");
    kj::_::Debug::Fault::fatal((Fault *)(local_48 + 0x20));
  }
  this->currentlyWriting = true;
  local_50.this = this;
  Function<void()>::Function<kj::PausableReadAsyncIoStream::trackWrite()::__0>
            ((Function<void()> *)local_48,&local_50);
  defer<kj::Function<void()>>(__return_storage_ptr__,(kj *)local_48,func);
  Function<void_()>::~Function((Function<void_()> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

_::Deferred<kj::Function<void()>> PausableReadAsyncIoStream::trackWrite() {
  KJ_REQUIRE(!currentlyWriting, "only one write is allowed at any one time");
  currentlyWriting = true;
  return kj::defer<kj::Function<void()>>([this]() { currentlyWriting = false; });
}